

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O1

int __thiscall
cmCTestCoverageHandler::HandleBlanketJSCoverage
          (cmCTestCoverageHandler *this,cmCTestCoverageHandlerContainer *cont)

{
  cmCTest *pcVar1;
  size_t sVar2;
  bool bVar3;
  cmCTestCoverageHandler *pcVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  long lVar5;
  ostream *poVar6;
  ulong uVar7;
  ulong uVar8;
  string coverageFile;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  blanketFiles;
  string line;
  string SourceDir;
  cmParseBlanketJSCoverage cov;
  Glob g;
  ifstream in;
  string local_378;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_358;
  cmCTestCoverageHandler *local_340;
  long *local_338;
  long local_328 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_318;
  cmCTestCoverageHandlerContainer *local_300;
  string local_2f8;
  string local_2d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2b8;
  cmParseBlanketJSCoverage local_2a0;
  Glob local_290;
  undefined1 local_238 [112];
  ios_base local_1c8 [408];
  
  local_300 = cont;
  cmParseBlanketJSCoverage::cmParseBlanketJSCoverage
            (&local_2a0,cont,(this->super_cmCTestGenericHandler).CTest);
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  local_238._0_8_ = local_238 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"SourceDirectory","");
  cmCTest::GetCTestConfiguration(&local_2d8,pcVar1,(string *)local_238);
  if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
    operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
  }
  local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_378,local_2d8._M_dataplus._M_p,
             local_2d8._M_dataplus._M_p + local_2d8._M_string_length);
  std::__cxx11::string::append((char *)&local_378);
  local_340 = this;
  cmsys::Glob::Glob(&local_290);
  local_358.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_358.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_358.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cmsys::Glob::FindFiles(&local_290,&local_378,(GlobMessages *)0x0);
  __x = cmsys::Glob::GetFiles_abi_cxx11_(&local_290);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&local_358,__x);
  local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
  local_2f8._M_string_length = 0;
  local_2f8.field_2._M_local_buf[0] = '\0';
  if (local_358.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_358.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar7 = 0;
    uVar8 = 1;
    do {
      std::ifstream::ifstream
                ((istream *)local_238,
                 local_358.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar7]._M_dataplus._M_p,_S_in);
      cmsys::SystemTools::GetLineFromStream((istream *)local_238,&local_2f8,(bool *)0x0,-1);
      cmsys::SystemTools::GetLineFromStream((istream *)local_238,&local_2f8,(bool *)0x0,-1);
      lVar5 = std::__cxx11::string::find((char *)&local_2f8,0x6317c4,0);
      if (lVar5 != -1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_318,
                    local_358.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar7);
      }
      std::ifstream::~ifstream((istream *)local_238);
      bVar3 = uVar8 < (ulong)((long)local_358.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_358.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5);
      uVar7 = uVar8;
      uVar8 = (ulong)((int)uVar8 + 1);
    } while (bVar3);
  }
  if (local_318.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_318.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
    pcVar4 = local_340;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_238," Cannot find BlanketJS coverage files: ",0x27);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_238,local_378._M_dataplus._M_p,local_378._M_string_length);
    std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    pcVar1 = (pcVar4->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,4,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x393,(char *)local_338,(pcVar4->super_cmCTestGenericHandler).Quiet);
    if (local_338 != local_328) {
      operator_delete(local_338,local_328[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_238);
    std::ios_base::~ios_base(local_1c8);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
    pcVar4 = local_340;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_238,"Found BlanketJS output JSON, Performing Coverage",0x30);
    std::ios::widen((char)(ostream *)local_238 + (char)*(undefined8 *)(local_238._0_8_ + -0x18));
    std::ostream::put((char)local_238);
    std::ostream::flush();
    pcVar1 = (pcVar4->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,4,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x38d,(char *)local_338,(pcVar4->super_cmCTestGenericHandler).Quiet);
    if (local_338 != local_328) {
      operator_delete(local_338,local_328[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_238);
    std::ios_base::~ios_base(local_1c8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_2b8,&local_358);
    cmParseBlanketJSCoverage::LoadCoverageData(&local_2a0,&local_2b8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_2b8);
  }
  sVar2 = (local_300->TotalCoverage)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p,
                    CONCAT71(local_2f8.field_2._M_allocated_capacity._1_7_,
                             local_2f8.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_318);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_358);
  cmsys::Glob::~Glob(&local_290);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._M_dataplus._M_p != &local_378.field_2) {
    operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  return (int)sVar2;
}

Assistant:

int cmCTestCoverageHandler::HandleBlanketJSCoverage(
  cmCTestCoverageHandlerContainer* cont)
{
  cmParseBlanketJSCoverage cov = cmParseBlanketJSCoverage(*cont, this->CTest);
  std::string SourceDir =
    this->CTest->GetCTestConfiguration("SourceDirectory");

  // Look for something other than output.json, still JSON extension.
  std::string coverageFile = SourceDir + "/*.json";
  cmsys::Glob g;
  std::vector<std::string> files;
  std::vector<std::string> blanketFiles;
  g.FindFiles(coverageFile);
  files = g.GetFiles();
  // Ensure that the JSON files found are the result of the
  // Blanket.js output. Check for the "node-jscoverage"
  // string on the second line
  std::string line;
  for (unsigned int fileEntry = 0; fileEntry < files.size(); fileEntry++) {
    cmsys::ifstream in(files[fileEntry].c_str());
    cmSystemTools::GetLineFromStream(in, line);
    cmSystemTools::GetLineFromStream(in, line);
    if (line.find("node-jscoverage") != std::string::npos) {
      blanketFiles.push_back(files[fileEntry]);
    }
  }
  //  Take all files with the node-jscoverage string and parse those
  if (!blanketFiles.empty()) {
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       "Found BlanketJS output JSON, Performing Coverage"
                         << std::endl,
                       this->Quiet);
    cov.LoadCoverageData(files);
  } else {
    cmCTestOptionalLog(
      this->CTest, HANDLER_VERBOSE_OUTPUT,
      " Cannot find BlanketJS coverage files: " << coverageFile << std::endl,
      this->Quiet);
  }
  return static_cast<int>(cont->TotalCoverage.size());
}